

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitDefinedFunction(PrintSExpression *this,Function *curr)

{
  size_t *this_00;
  bool bVar1;
  Index IVar2;
  size_type sVar3;
  reference pDVar4;
  size_t sVar5;
  ostream *poVar6;
  Type TVar7;
  Block *pBVar8;
  Expression **ppEVar9;
  pointer ir;
  Name name;
  bool local_129;
  _Rb_tree_const_iterator<wasm::Function::DebugLocation> local_108;
  _Rb_tree_const_iterator<wasm::Function::DebugLocation> local_100;
  Expression *local_f8;
  Expression *item;
  Iterator __end4;
  Iterator __begin4;
  ExpressionList *__range4;
  Block *block;
  ostream *local_b8;
  size_t i_1;
  BasicType local_a4;
  Type local_a0;
  uintptr_t local_98;
  ostream *local_90;
  Type *param;
  Iterator __end3;
  Iterator __begin3;
  Type *__range3;
  Type TStack_50;
  Index i;
  uintptr_t local_48;
  anon_unknown_217 *local_40;
  ostream *local_38;
  _Rb_tree_const_iterator<wasm::Function::DebugLocation> local_30;
  undefined4 local_24;
  undefined4 uStack_20;
  undefined4 local_1c;
  Function *local_18;
  Function *curr_local;
  PrintSExpression *this_local;
  
  local_18 = curr;
  curr_local = (Function *)this;
  doIndent(this->o,this->indent);
  this->currFunction = local_18;
  local_24 = 0;
  uStack_20 = 0;
  local_1c = 0;
  (this->lastPrintedLocation).fileIndex = 0;
  (this->lastPrintedLocation).lineNumber = 0;
  (this->lastPrintedLocation).columnNumber = 0;
  sVar3 = std::
          set<wasm::Function::DebugLocation,_std::less<wasm::Function::DebugLocation>,_std::allocator<wasm::Function::DebugLocation>_>
          ::size(&this->currFunction->prologLocation);
  if (sVar3 != 0) {
    local_30._M_node =
         (_Base_ptr)
         std::
         set<wasm::Function::DebugLocation,_std::less<wasm::Function::DebugLocation>,_std::allocator<wasm::Function::DebugLocation>_>
         ::begin(&this->currFunction->prologLocation);
    pDVar4 = std::_Rb_tree_const_iterator<wasm::Function::DebugLocation>::operator*(&local_30);
    printDebugLocation(this,pDVar4);
  }
  std::operator<<(this->o,'(');
  printMajor(this->o,"func ");
  local_40 = (anon_unknown_217 *)
             (local_18->super_Importable).super_Named.name.super_IString.str._M_len;
  local_38 = (ostream *)(local_18->super_Importable).super_Named.name.super_IString.str._M_str;
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)local_38;
  anon_unknown_217::printName(local_40,name,local_38);
  if ((this->currModule != (Module *)0x0) &&
     (bVar1 = FeatureSet::hasGC(&this->currModule->features), bVar1)) {
    std::operator<<(this->o," (type ");
    local_48 = (local_18->type).id;
    poVar6 = anon_unknown_217::printHeapType(this->o,(HeapType)local_48,this->currModule);
    std::operator<<(poVar6,')');
  }
  if ((((this->stackIR & 1U) == 0) &&
      (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->stackIR), bVar1)) &&
     ((this->minify & 1U) == 0)) {
    std::operator<<(this->o," (; has Stack IR ;)");
  }
  TStack_50 = Function::getParams(local_18);
  sVar5 = wasm::Type::size(&stack0xffffffffffffffb0);
  if (sVar5 != 0) {
    __range3._4_4_ = 0;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)Function::getParams(local_18);
    this_00 = &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    join_0x00000010_0x00000000_ =
         (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
         wasm::Type::begin((Type *)this_00);
    _param = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
             wasm::Type::end((Type *)this_00);
    while (bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                             ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                              &__end3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      *)&param), bVar1) {
      poVar6 = (ostream *)
               wasm::Type::Iterator::operator*
                         ((Iterator *)
                          &__end3.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         );
      local_90 = poVar6;
      std::operator<<(this->o,this->maybeSpace);
      std::operator<<(this->o,'(');
      printMinor(this->o,"param ");
      anon_unknown_217::printLocal
                ((anon_unknown_217 *)(ulong)__range3._4_4_,(Index)this->currFunction,
                 (Function *)this->o,poVar6);
      std::operator<<(this->o,' ');
      local_98 = *(uintptr_t *)local_90;
      poVar6 = anon_unknown_217::printType(this->o,(Type)local_98,this->currModule);
      std::operator<<(poVar6,')');
      __range3._4_4_ = __range3._4_4_ + 1;
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    }
  }
  local_a0 = Function::getResults(local_18);
  local_a4 = none;
  bVar1 = wasm::Type::operator!=(&local_a0,&local_a4);
  if (bVar1) {
    std::operator<<(this->o,this->maybeSpace);
    poVar6 = this->o;
    TVar7 = Function::getResults(local_18);
    anon_unknown_217::printResultType(poVar6,TVar7,this->currModule);
  }
  incIndent(this);
  IVar2 = Function::getVarIndexBase(local_18);
  for (local_b8 = (ostream *)(ulong)IVar2; poVar6 = (ostream *)Function::getNumLocals(local_18),
      local_b8 < poVar6; local_b8 = local_b8 + 1) {
    doIndent(this->o,this->indent);
    std::operator<<(this->o,'(');
    printMinor(this->o,"local ");
    poVar6 = anon_unknown_217::printLocal
                       ((anon_unknown_217 *)((ulong)local_b8 & 0xffffffff),(Index)this->currFunction
                        ,(Function *)this->o,local_b8);
    std::operator<<(poVar6,' ');
    poVar6 = this->o;
    TVar7 = Function::getLocalType(local_18,(Index)local_b8);
    poVar6 = anon_unknown_217::printType(poVar6,TVar7,this->currModule);
    std::operator<<(poVar6,')');
    std::operator<<(this->o,this->maybeNewLine);
  }
  if (((this->stackIR & 1U) != 0) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->stackIR), bVar1)) {
    ir = std::
         unique_ptr<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
         ::get(&local_18->stackIR);
    printStackIR(ir,this->o,local_18);
    goto LAB_0198a360;
  }
  if (((this->full & 1U) == 0) && (bVar1 = Expression::is<wasm::Block>(local_18->body), bVar1)) {
    pBVar8 = Expression::cast<wasm::Block>(local_18->body);
    bVar1 = IString::isNull(&(pBVar8->name).super_IString);
    if (!bVar1) goto LAB_0198a2f9;
    pBVar8 = Expression::cast<wasm::Block>(local_18->body);
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pBVar8->list).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _item = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                      (&(pBVar8->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    while (bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4.index,(Iterator *)&item), bVar1) {
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end4.index);
      local_f8 = *ppEVar9;
      printFullLine(this,local_f8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4.index);
    }
  }
  else {
LAB_0198a2f9:
    printFullLine(this,local_18->body);
  }
  if (this->controlFlowDepth != 0) {
    __assert_fail("controlFlowDepth == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                  ,0xc75,"void wasm::PrintSExpression::visitDefinedFunction(Function *)");
  }
LAB_0198a360:
  sVar3 = std::
          set<wasm::Function::DebugLocation,_std::less<wasm::Function::DebugLocation>,_std::allocator<wasm::Function::DebugLocation>_>
          ::size(&this->currFunction->epilogLocation);
  local_129 = false;
  if (sVar3 != 0) {
    local_100._M_node =
         (_Base_ptr)
         std::
         set<wasm::Function::DebugLocation,_std::less<wasm::Function::DebugLocation>,_std::allocator<wasm::Function::DebugLocation>_>
         ::begin(&this->currFunction->epilogLocation);
    pDVar4 = std::_Rb_tree_const_iterator<wasm::Function::DebugLocation>::operator*(&local_100);
    local_129 = Function::DebugLocation::operator!=(&this->lastPrintedLocation,pDVar4);
  }
  if (local_129 == false) {
    decIndent(this);
  }
  else {
    doIndent(this->o,this->indent);
    if ((this->minify & 1U) == 0) {
      this->indent = this->indent - 1;
    }
    local_108._M_node =
         (_Base_ptr)
         std::
         set<wasm::Function::DebugLocation,_std::less<wasm::Function::DebugLocation>,_std::allocator<wasm::Function::DebugLocation>_>
         ::begin(&this->currFunction->epilogLocation);
    pDVar4 = std::_Rb_tree_const_iterator<wasm::Function::DebugLocation>::operator*(&local_108);
    printDebugLocation(this,pDVar4);
    std::operator<<(this->o,')');
  }
  std::operator<<(this->o,this->maybeNewLine);
  return;
}

Assistant:

void visitDefinedFunction(Function* curr) {
    doIndent(o, indent);
    currFunction = curr;
    lastPrintedLocation = {0, 0, 0};
    if (currFunction->prologLocation.size()) {
      printDebugLocation(*currFunction->prologLocation.begin());
    }
    o << '(';
    printMajor(o, "func ");
    printName(curr->name, o);
    if (currModule && currModule->features.hasGC()) {
      o << " (type ";
      printHeapType(o, curr->type, currModule) << ')';
    }
    if (!stackIR && curr->stackIR && !minify) {
      o << " (; has Stack IR ;)";
    }
    if (curr->getParams().size() > 0) {
      Index i = 0;
      for (const auto& param : curr->getParams()) {
        o << maybeSpace;
        o << '(';
        printMinor(o, "param ");
        printLocal(i, currFunction, o);
        o << ' ';
        printType(o, param, currModule) << ')';
        ++i;
      }
    }
    if (curr->getResults() != Type::none) {
      o << maybeSpace;
      printResultType(o, curr->getResults(), currModule);
    }
    incIndent();
    for (size_t i = curr->getVarIndexBase(); i < curr->getNumLocals(); i++) {
      doIndent(o, indent);
      o << '(';
      printMinor(o, "local ");
      printLocal(i, currFunction, o) << ' ';
      printType(o, curr->getLocalType(i), currModule) << ')';
      o << maybeNewLine;
    }
    // Print the body.
    if (!stackIR || !curr->stackIR) {
      // It is ok to emit a block here, as a function can directly contain a
      // list, even if our ast avoids that for simplicity. We can just do that
      // optimization here..
      if (!full && curr->body->is<Block>() &&
          curr->body->cast<Block>()->name.isNull()) {
        Block* block = curr->body->cast<Block>();
        for (auto item : block->list) {
          printFullLine(item);
        }
      } else {
        printFullLine(curr->body);
      }
      assert(controlFlowDepth == 0);
    } else {
      // Print the stack IR.
      printStackIR(curr->stackIR.get(), o, curr);
    }
    if (currFunction->epilogLocation.size() &&
        lastPrintedLocation != *currFunction->epilogLocation.begin()) {
      // Print last debug location: mix of decIndent and printDebugLocation
      // logic.
      doIndent(o, indent);
      if (!minify) {
        indent--;
      }
      printDebugLocation(*currFunction->epilogLocation.begin());
      o << ')';
    } else {
      decIndent();
    }
    o << maybeNewLine;
  }